

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello ",6);
  show_color(just::console::impl::color<void>::red);
  show_color(just::console::impl::color<void>::green);
  show_color(just::console::impl::color<void>::blue);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"World!",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  using just::console::color;

  std::cout << "Hello ";

  show_color(color::red);
  show_color(color::green);
  show_color(color::blue);

  just::console::reset();
  std::cout << "World!" << std::endl;
}